

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAnimatedMeshSceneNode.cpp
# Opt level: O1

bool __thiscall
irr::scene::CAnimatedMeshSceneNode::removeChild(CAnimatedMeshSceneNode *this,ISceneNode *child)

{
  pointer ppIVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  
  bVar2 = ISceneNode::removeChild((ISceneNode *)this,child);
  if ((bVar2) && (this->JointsUsed == true)) {
    ppIVar1 = (this->JointChildSceneNodes).m_data.
              super__Vector_base<irr::scene::IBoneSceneNode_*,_std::allocator<irr::scene::IBoneSceneNode_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    iVar3 = (int)((ulong)((long)(this->JointChildSceneNodes).m_data.
                                super__Vector_base<irr::scene::IBoneSceneNode_*,_std::allocator<irr::scene::IBoneSceneNode_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar1) >> 3);
    if (iVar3 != 0) {
      lVar4 = 0;
      do {
        if (&ppIVar1[lVar4]->super_ISceneNode == child) {
          ppIVar1[lVar4] = (IBoneSceneNode *)0x0;
          return bVar2;
        }
        lVar4 = lVar4 + 1;
      } while (iVar3 != (int)lVar4);
    }
  }
  return bVar2;
}

Assistant:

bool CAnimatedMeshSceneNode::removeChild(ISceneNode *child)
{
	if (ISceneNode::removeChild(child)) {
		if (JointsUsed) { // stop weird bugs caused while changing parents as the joints are being created
			for (u32 i = 0; i < JointChildSceneNodes.size(); ++i) {
				if (JointChildSceneNodes[i] == child) {
					JointChildSceneNodes[i] = 0; // remove link to child
					break;
				}
			}
		}
		return true;
	}

	return false;
}